

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_cipher_do_mgm(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t len)

{
  int iVar1;
  int iVar2;
  size_t len_00;
  uchar *in_RCX;
  mgm128_context *in_RDX;
  size_t in_RSI;
  uchar *in_RDI;
  uchar *unaff_retaddr;
  mgm128_context *in_stack_00000008;
  int enc;
  gost_mgm_ctx *mctx;
  char *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  len_00 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
  iVar2 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  if (*(int *)(len_00 + 0x1088) == 0) {
    ERR_GOST_error(iVar2,(int)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
    iVar1 = -1;
  }
  else if (*(int *)(len_00 + 0x108c) == 0) {
    ERR_GOST_error(iVar2,(int)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
    iVar1 = -1;
  }
  else if (in_RDX == (mgm128_context *)0x0) {
    if (iVar1 == 0) {
      if (*(int *)(len_00 + 0x1164) < 0) {
        iVar1 = -1;
      }
      else {
        EVP_CIPHER_CTX_buf_noconst(in_RDI);
        iVar1 = gost_mgm128_finish((mgm128_context *)
                                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                   in_RDI,in_RSI);
        if (iVar1 == 0) {
          *(undefined4 *)(len_00 + 0x108c) = 0;
          iVar1 = 0;
        }
        else {
          iVar1 = -1;
        }
      }
    }
    else {
      EVP_CIPHER_CTX_buf_noconst(in_RDI);
      gost_mgm128_tag(in_RDX,in_RCX,len_00);
      *(undefined4 *)(len_00 + 0x1164) = 0x10;
      *(undefined4 *)(len_00 + 0x108c) = 0;
      iVar1 = 0;
    }
  }
  else if (in_RSI == 0) {
    iVar2 = gost_mgm128_aad((mgm128_context *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,0);
    iVar1 = (int)in_RCX;
    if (iVar2 != 0) {
      iVar1 = -1;
    }
  }
  else if (iVar1 == 0) {
    iVar2 = gost_mgm128_decrypt(in_stack_00000008,unaff_retaddr,
                                (uchar *)CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),(size_t)in_RDI);
    iVar1 = (int)in_RCX;
    if (iVar2 != 0) {
      iVar1 = -1;
    }
  }
  else {
    iVar2 = gost_mgm128_encrypt(in_stack_00000008,unaff_retaddr,
                                (uchar *)CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),(size_t)in_RDI);
    iVar1 = (int)in_RCX;
    if (iVar2 != 0) {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

static int gost_grasshopper_cipher_do_mgm(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                   const unsigned char *in, size_t len)
{
    gost_mgm_ctx *mctx =
        (gost_mgm_ctx *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    int enc = EVP_CIPHER_CTX_encrypting(ctx);

    /* If not set up, return error */
    if (!mctx->key_set) {
        GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_DO_MGM,
                GOST_R_BAD_ORDER);
        return -1;
    }

    if (!mctx->iv_set) {
        GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_DO_MGM,
                GOST_R_BAD_ORDER);
        return -1;
    }
    if (in) {
        if (out == NULL) {
            if (gost_mgm128_aad(&mctx->mgm, in, len))
                return -1;
        } else if (enc) {
            if (gost_mgm128_encrypt(&mctx->mgm, in, out, len))
                return -1;
        } else {
            if (gost_mgm128_decrypt(&mctx->mgm, in, out, len))
                return -1;
        }
        return len;
    } else {
        if (!enc) {
            if (mctx->taglen < 0)
                return -1;
            if (gost_mgm128_finish(&mctx->mgm,
                                   EVP_CIPHER_CTX_buf_noconst(ctx),
                                   mctx->taglen) != 0)
                return -1;
            mctx->iv_set = 0;
            return 0;
        }
        gost_mgm128_tag(&mctx->mgm, EVP_CIPHER_CTX_buf_noconst(ctx), 16);
        mctx->taglen = 16;
        /* Don't reuse the IV */
        mctx->iv_set = 0;
        return 0;
    }

}